

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::ParmParse::addfile(string *filename)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *in_RDI;
  string *this;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  allocator_type *in_stack_ffffffffffffff78;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  string *psVar1;
  iterator in_stack_ffffffffffffff88;
  undefined1 *puVar2;
  undefined1 local_65 [13];
  string *local_58;
  string local_50 [32];
  string *local_30;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  local_58 = local_50;
  std::__cxx11::string::string(local_58,in_RDI);
  local_30 = local_50;
  tab = (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)0x1;
  puVar2 = local_65;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x11a40fb);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_stack_ffffffffffffff88;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(in_stack_ffffffffffffff80,__l,in_stack_ffffffffffffff78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x11a4129);
  psVar1 = local_50;
  this = (string *)&local_30;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar1);
  anon_unknown_12::addDefn(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,tab);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x11a418d);
  return;
}

Assistant:

void
ParmParse::addfile (std::string const filename) {
    auto l = std::list<std::string>{filename};
    addDefn(FileKeyword,
            l,
            g_table);
}